

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *objToStore,
               XSerializeEngine *serEng)

{
  ushort uVar1;
  bool bVar2;
  uint ui;
  ushort *key1;
  XMLStringPool *pXVar3;
  _func_int **__n;
  XMLSize_t XVar4;
  ushort *puVar5;
  void *pvVar6;
  void *extraout_RDX;
  RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *pRVar7;
  int __fd;
  XMLSize_t XVar8;
  RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> local_60;
  
  bVar2 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar2) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    local_60.fMemoryManager = objToStore->fMemoryManager;
    local_60.super_XMLEnumerator<xercesc_4_0::XercesGroupInfo>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00407900;
    local_60.fAdopted = false;
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0;
    local_60.fCurHash = 0;
    pRVar7 = local_60.fCurElem;
    if (objToStore->fHashModulus != 0) {
      XVar8 = 1;
      do {
        XVar4 = XVar8;
        pRVar7 = objToStore->fBucketList[XVar4 - 1];
        if (objToStore->fBucketList[XVar4 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0) break;
        XVar8 = XVar4 + 1;
        pRVar7 = local_60.fCurElem;
        local_60.fCurHash = XVar4;
      } while (XVar4 != objToStore->fHashModulus);
    }
    local_60.fCurElem = pRVar7;
    XVar8 = 0;
    local_60.fToEnum = objToStore;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::nextElement
                (&local_60);
      XVar8 = XVar8 + 1;
    }
    XSerializeEngine::writeSize(serEng,XVar8);
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0;
    local_60.fCurHash = 0;
    pRVar7 = local_60.fCurElem;
    if ((local_60.fToEnum)->fHashModulus != 0) {
      XVar8 = 1;
      do {
        XVar4 = XVar8;
        pRVar7 = (local_60.fToEnum)->fBucketList[XVar4 - 1];
        if ((local_60.fToEnum)->fBucketList[XVar4 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0) break;
        XVar8 = XVar4 + 1;
        pRVar7 = local_60.fCurElem;
        local_60.fCurHash = XVar4;
      } while (XVar4 != (local_60.fToEnum)->fHashModulus);
    }
    local_60.fCurElem = pRVar7;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      key1 = (ushort *)
             RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
             nextElementKey(&local_60);
      pXVar3 = XSerializeEngine::getStringPool(serEng);
      __n = (pXVar3->super_XSerializable)._vptr_XSerializable;
      ui = (*__n[9])(pXVar3,key1);
      XSerializeEngine::operator<<(serEng,ui);
      if ((key1 == (ushort *)0x0) || (__n = (_func_int **)(ulong)*key1, __n == (_func_int **)0x0)) {
        pvVar6 = (void *)0x0;
      }
      else {
        uVar1 = key1[1];
        if (uVar1 != 0) {
          puVar5 = key1 + 2;
          do {
            __n = (_func_int **)((ulong)uVar1 + ((ulong)__n >> 0x18) + (long)__n * 0x26);
            uVar1 = *puVar5;
            puVar5 = puVar5 + 1;
          } while (uVar1 != 0);
        }
        pvVar6 = (void *)((ulong)__n % objToStore->fHashModulus);
      }
      for (pRVar7 = objToStore->fBucketList[(long)pvVar6];
          pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0;
          pRVar7 = pRVar7->fNext) {
        bVar2 = StringHasher::equals((StringHasher *)&objToStore->field_0x30,key1,pRVar7->fKey);
        pvVar6 = extraout_RDX;
        if (bVar2) {
          __fd = (int)pRVar7->fData;
          goto LAB_002cbef4;
        }
      }
      __fd = 0;
LAB_002cbef4:
      XSerializeEngine::write(serEng,__fd,pvVar6,(size_t)__n);
    }
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_60);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XercesGroupInfo>* const objToStore
                                    , XSerializeEngine&                      serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XercesGroupInfo> e(objToStore, false, objToStore->getMemoryManager());
        XMLSize_t itemNumber = 0;

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //to sort the key
        SORT_KEYSET_ONEKEY(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            unsigned int id  = serEng.getStringPool()->getId(strKey);
            serEng<<id;

            XercesGroupInfo* data = objToStore->get(strKey);
            serEng<<data;
        }
#else
        while (e.hasMoreElements())
        {
            XMLCh*       key = (XMLCh*) e.nextElementKey();
            unsigned int id  = serEng.getStringPool()->getId(key);

           // key = StringPool->getValueForId(XercesGroupInfo::getNameSpaceId())
           //     + chComma
           //     + StringPool->getValueForId(XercesGroupInfo::getNameId())
           //
           // and the key is guranteed in the StringPool
           //
           //
           //  if (id == 0)
           //  {
           //      throw exception
           //   }
           //

            serEng<<id;

            XercesGroupInfo* data = objToStore->get(key);
            serEng<<data;
        }
#endif
    }
}